

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CHARACTER::OMultiply(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  uint uVar2;
  Object *pOVar3;
  Type *pTVar4;
  Character *pCVar5;
  Number *pNVar6;
  String *pSVar7;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar8;
  Variable VVar9;
  String local_98;
  undefined1 local_71;
  String local_70;
  undefined1 local_49;
  undefined4 local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_CHARACTER *this_local;
  Variable *res;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar3 = Variable::operator->(in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar1 = Type::operator!=(pTVar4,(Type *)_type_number);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar3 = Variable::operator->((Variable *)local_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar1 = Type::operator!=(pTVar4,(Type *)_type_number);
    if (bVar1) {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    }
    else {
      local_49 = 0;
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->(obj2);
      pCVar5 = Object::GetData<LiteScript::Character>(pOVar3);
      pOVar3 = Variable::operator->((Variable *)local_38);
      pNVar6 = Object::GetData<LiteScript::Number>(pOVar3);
      uVar2 = Number::operator_cast_to_int(pNVar6);
      Character::operator*(&local_70,pCVar5,uVar2);
      pOVar3 = Variable::operator->((Variable *)this);
      pSVar7 = Object::GetData<LiteScript::String>(pOVar3);
      String::operator=(pSVar7,&local_70);
      String::~String(&local_70);
      local_49 = 1;
    }
    local_48 = 1;
    Variable::~Variable((Variable *)local_38);
    puVar8 = extraout_RDX;
  }
  else {
    local_71 = 0;
    pOVar3 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->(obj2);
    pCVar5 = Object::GetData<LiteScript::Character>(pOVar3);
    pOVar3 = Variable::operator->((Variable *)tmp.nb_ref);
    pNVar6 = Object::GetData<LiteScript::Number>(pOVar3);
    uVar2 = Number::operator_cast_to_int(pNVar6);
    Character::operator*(&local_98,pCVar5,uVar2);
    pOVar3 = Variable::operator->((Variable *)this);
    pSVar7 = Object::GetData<LiteScript::String>(pOVar3);
    String::operator=(pSVar7,&local_98);
    String::~String(&local_98);
    puVar8 = extraout_RDX_00;
  }
  VVar9.nb_ref = puVar8;
  VVar9.obj = (Object *)this;
  return VVar9;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OMultiply(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::NUMBER) {
        Variable tmp = obj2.Convert(Type::NUMBER);
        if (tmp->GetType() != Type::NUMBER)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<Character>() * (unsigned int)(int)tmp->GetData<Number>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<Character>() * (unsigned int)(int)obj2->GetData<Number>();
    return res;
}